

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplayingHammerer.cpp
# Opt level: O2

void ReplayingHammerer::find_direct_effective_aggs
               (HammeringPattern *pattern,PatternAddressMapper *mapper,
               unordered_set<AggressorAccessPattern,_std::hash<AggressorAccessPattern>,_std::equal_to<AggressorAccessPattern>,_std::allocator<AggressorAccessPattern>_>
               *direct_effective_aggs)

{
  _Rb_tree_node_base *__k;
  size_t *__return_storage_ptr__;
  pointer pBVar1;
  AggressorAccessPattern *pAVar2;
  pointer pAVar3;
  key_type *pkVar4;
  _Alloc_hider args_1;
  int iVar5;
  reference pvVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  int iVar11;
  AggressorAccessPattern *other;
  int iVar12;
  Aggressor *agg_1;
  key_type *__k_00;
  BitFlip *bf;
  pointer pBVar13;
  Aggressor *agg;
  pointer __k_01;
  undefined8 *puVar14;
  undefined1 local_2d0 [8];
  pair<int,_AggressorAccessPattern> data;
  undefined1 local_148 [8];
  set<int,_std::less<int>,_std::allocator<int>_> flipped_rows;
  string local_f8;
  char *local_d8 [4];
  undefined1 local_b8 [8];
  unordered_map<int,_std::pair<int,_AggressorAccessPattern>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>_>
  matches;
  allocator<char> local_31;
  
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&flipped_rows;
  flipped_rows._M_t._M_impl._0_4_ = 0;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((mapper->bit_flips).
      super__Vector_base<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (mapper->bit_flips).
      super__Vector_base<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pvVar6 = std::
             vector<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
             ::at(&mapper->bit_flips,0);
    pBVar1 = (pvVar6->super__Vector_base<BitFlip,_std::allocator<BitFlip>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pBVar13 = (pvVar6->super__Vector_base<BitFlip,_std::allocator<BitFlip>_>)._M_impl.
                   super__Vector_impl_data._M_start; pBVar13 != pBVar1; pBVar13 = pBVar13 + 1) {
      local_2d0._0_4_ = (undefined4)(pBVar13->address).row;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_148,(int *)local_2d0);
    }
    local_b8 = (undefined1  [8])&matches._M_h._M_rehash_policy._M_next_resize;
    matches._M_h._M_buckets = (__buckets_ptr)0x1;
    matches._M_h._M_bucket_count = 0;
    matches._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    matches._M_h._M_element_count._0_4_ = 0x3f800000;
    matches._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    matches._M_h._M_rehash_policy._4_4_ = 0;
    matches._M_h._M_rehash_policy._M_next_resize = 0;
    for (p_Var10 = flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 != (_Rb_tree_node_base *)&flipped_rows;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      __k = p_Var10 + 1;
      pAVar2 = (pattern->agg_access_patterns).
               super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (other = (pattern->agg_access_patterns).
                   super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
                   ._M_impl.super__Vector_impl_data._M_start; other != pAVar2; other = other + 1) {
        pAVar3 = (other->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        iVar12 = 0x7fffffff;
        for (__k_01 = (other->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                      _M_impl.super__Vector_impl_data._M_start; __k_01 != pAVar3;
            __k_01 = __k_01 + 1) {
          pmVar7 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&mapper->aggressor_to_addr,&__k_01->id);
          iVar5 = (int)pmVar7->row - __k->_M_color;
          iVar11 = -iVar5;
          if (0 < iVar5) {
            iVar11 = iVar5;
          }
          if (iVar11 < iVar12) {
            iVar12 = iVar11;
          }
        }
        sVar8 = std::
                _Hashtable<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count((_Hashtable<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)local_b8,(key_type_conflict *)__k);
        if (sVar8 == 0) {
LAB_00118b63:
          local_2d0._0_4_ = iVar12;
          AggressorAccessPattern::AggressorAccessPattern((AggressorAccessPattern *)&data,other);
          pmVar9 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_b8,(key_type *)__k);
          std::pair<int,_AggressorAccessPattern>::operator=(pmVar9,(type)local_2d0);
          std::_Vector_base<Aggressor,_std::allocator<Aggressor>_>::~_Vector_base
                    ((_Vector_base<Aggressor,_std::allocator<Aggressor>_> *)
                     &data.second.start_offset);
        }
        else {
          sVar8 = std::
                  _Hashtable<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count((_Hashtable<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)local_b8,(key_type_conflict *)__k);
          if (sVar8 != 0) {
            pmVar9 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)local_b8,(key_type *)__k);
            if (iVar12 < pmVar9->first) goto LAB_00118b63;
          }
        }
      }
    }
    __return_storage_ptr__ = &flipped_rows._M_t._M_impl.super__Rb_tree_header._M_node_count;
    for (puVar14 = (undefined8 *)matches._M_h._M_bucket_count; puVar14 != (undefined8 *)0x0;
        puVar14 = (undefined8 *)*puVar14) {
      if (*(int *)(puVar14 + 2) < 6) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_2d0);
        std::operator<<((ostream *)&data.second,"[");
        pkVar4 = (key_type *)puVar14[7];
        for (__k_00 = (key_type *)puVar14[6]; __k_00 != pkVar4; __k_00 = __k_00 + 1) {
          pmVar7 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&mapper->aggressor_to_addr,__k_00);
          DRAMAddr::to_string_compact_abi_cxx11_((string *)__return_storage_ptr__,pmVar7);
          std::operator<<((ostream *)&data.second,(string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
          if (*__k_00 != *(int *)(puVar14[7] + -4)) {
            std::operator<<((ostream *)&data.second,",");
          }
        }
        std::operator<<((ostream *)&data.second,"]");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&matches._M_h._M_single_bucket,
                   "Flip in row %d, probably caused by [%s] -> %s due to minimum distance %d.",
                   &local_31);
        iVar12 = *(int *)(puVar14 + 1);
        AggressorAccessPattern::to_string_abi_cxx11_
                  (&local_f8,(AggressorAccessPattern *)(puVar14 + 3));
        args_1._M_p = local_f8._M_dataplus._M_p;
        std::__cxx11::stringbuf::str();
        format_string<int,char_const*,char_const*,int>
                  ((string *)__return_storage_ptr__,(string *)&matches._M_h._M_single_bucket,iVar12,
                   args_1._M_p,local_d8[0],*(int *)(puVar14 + 2));
        Logger::log_data((string *)__return_storage_ptr__,true);
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&matches._M_h._M_single_bucket);
        std::__detail::
        _Insert_base<AggressorAccessPattern,_AggressorAccessPattern,_std::allocator<AggressorAccessPattern>,_std::__detail::_Identity,_std::equal_to<AggressorAccessPattern>,_std::hash<AggressorAccessPattern>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<AggressorAccessPattern,_AggressorAccessPattern,_std::allocator<AggressorAccessPattern>,_std::__detail::_Identity,_std::equal_to<AggressorAccessPattern>,_std::hash<AggressorAccessPattern>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)direct_effective_aggs,(AggressorAccessPattern *)(puVar14 + 3));
        std::__cxx11::stringstream::~stringstream((stringstream *)local_2d0);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,
                   "Aggressor %d with distance %d from flipped row is too far away for being considered as effective. Skipping it."
                   ,(allocator<char> *)&matches._M_h._M_single_bucket);
        format_string<int,int>
                  ((string *)local_2d0,(string *)__return_storage_ptr__,*(int *)(puVar14 + 1),
                   *(int *)(puVar14 + 2));
        Logger::log_info((string *)local_2d0,true);
        std::__cxx11::string::~string((string *)local_2d0);
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
    }
    std::
    _Hashtable<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_b8);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_148);
  return;
}

Assistant:

void ReplayingHammerer::find_direct_effective_aggs(HammeringPattern &pattern,
                                                   PatternAddressMapper &mapper,
                                                   std::unordered_set<AggressorAccessPattern> &direct_effective_aggs) {
  // we consider an aggressor as being responsible for a bit flip if it is at maximum DIST_THRESHOLD rows away from
  // the flipped row
  const int DIST_THRESHOLD = 5;

  // prerequisite: know which aggressor pair triggered a bit flip
  // get all flipped rows
  std::set<int> flipped_rows;
  if (mapper.bit_flips.size() == 0) return;
  for (const auto &bf : mapper.bit_flips.at(0)) flipped_rows.insert(static_cast<int>(bf.address.row));

  // map to keep track of best guess which AggressorAccessPattern caused a bit flip.
  // maps (aggressor ID) to (distance, AggressorAccessPattern)
  std::unordered_map<int, std::pair<int, AggressorAccessPattern>> matches;

  // iterate over all (unique) bit flips and compute the distance to all AggressorAccessPatterns, remember the
  // AggressorAccessPattern with the lowest distance - this is probably the one that triggered the bit flip
  // TODO: handle the case where multiple aggressors have the same distance to the flipped row
  // TODO: add threshold, e.g., if smallest distance of AggressorAccessPatterns and flipped row is larger than
  //  X rows, there's probably remapping going on and we cannot tell which AggressorAccessPattern caused the flip
  auto &cur_mapping = mapper.aggressor_to_addr;
  for (const auto &flipped_row : flipped_rows) {
    for (auto &agg_pair : pattern.agg_access_patterns) {
      // take the smaller distance of the aggressors as the distance of the aggressor pair
      int min_distance = std::numeric_limits<int>::max();
      for (const auto &agg : agg_pair.aggressors) {
        // measure distance between aggs in agg pairs and flipped bit
        auto cur_distance = std::abs((int) cur_mapping.at(agg.id).row - flipped_row);
        min_distance = std::min(min_distance, cur_distance);
      }
      // check if we don't have any 'best' candidate for this bit flip yet (a) or whether this distance is lower
      // than the distance of the best candidate found so far (b)
      if (matches.count(flipped_row)==0  // (a)
          || (matches.count(flipped_row) > 0 && matches.at(flipped_row).first > min_distance)) { // (b)
        auto data = std::make_pair(min_distance, agg_pair);
        matches[flipped_row] = data;
      }
    }
  }

  // direct_effective_aggs contains an AggressorAccessPattern for each flipped row, that's the pattern with the
  // lowest distance to the flipped row
  for (const auto &fr : matches) {
    // if the distance to the flipped row is larger than the defined threshold, we don't consider the aggressor as being
    // the one who triggered the bit flip as probably remapping is going on
    if (fr.second.first > DIST_THRESHOLD) {
      Logger::log_info(
          format_string("Aggressor %d with distance %d from flipped row is too far away for being considered as effective. Skipping it.",
          fr.first, fr.second.first));
      continue;
    }

    std::stringstream sstream;
    sstream << "[";
    for (auto &agg : fr.second.second.aggressors) {
      sstream << mapper.aggressor_to_addr.at(agg.id).to_string_compact();
      if (agg.id!=fr.second.second.aggressors.rbegin()->id) sstream << ",";
    }
    sstream << "]";
    Logger::log_data(format_string("Flip in row %d, probably caused by [%s] -> %s due to minimum distance %d.",
        fr.first, fr.second.second.to_string().c_str(), sstream.str().c_str(), fr.second.first));
    direct_effective_aggs.insert(fr.second.second);
  }
}